

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint height;
  bool bVar1;
  undefined7 extraout_var;
  Fault local_70;
  Fault f_1;
  size_t local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  size_t size_local;
  BTreeImpl *this_local;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> f_local;
  
  height = this->height;
  _kjCondition._32_8_ = ctx;
  this_local = (BTreeImpl *)sig;
  f_local.space._0_8_ = siglen;
  MaybeUint::MaybeUint((MaybeUint *)((long)&f_1.exception + 4),(void *)0x0);
  local_60 = verifyNode(this,(size_t)ctx,
                        (FunctionParam<bool_(unsigned_int,_unsigned_int)> *)&this_local,0,height,
                        f_1.exception._4_4_);
  local_58 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_60);
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_50,&local_58,
             (unsigned_long *)&_kjCondition.result);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0xa8,FAILED,"verifyNode(size, f, 0, height, nullptr) == size","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)local_50);
    Debug::Fault::fatal(&local_70);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}